

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

void Assimp::FBX::ParseVectorDataArray
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *out,Element *el)

{
  Token *t;
  pointer ppTVar1;
  char *end;
  pointer pcVar2;
  int iVar3;
  size_t __n;
  Scope *sc;
  Element *pEVar4;
  Element *in_R9;
  pointer ppTVar5;
  long lVar6;
  char type;
  allocator local_79;
  string local_78;
  vector<char,_std::allocator<char>_> buff;
  char *data;
  uint32_t count;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(out,0);
  ppTVar5 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar5 ==
      (el->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_78,"unexpected empty element",(allocator *)&buff);
    anon_unknown.dwarf_bf1eac::ParseError(&local_78,el);
  }
  t = *ppTVar5;
  if (t->column == 0xffffffff) {
    data = t->sbegin;
    end = t->send;
    anon_unknown_20::ReadBinaryDataArrayHead(&data,end,&type,&count,el);
    if ((ulong)count != 0) {
      if (type != 'i') {
        std::__cxx11::string::string
                  ((string *)&local_78,"expected (u)int array (binary)",(allocator *)&buff);
        anon_unknown.dwarf_bf1eac::ParseError(&local_78,el);
      }
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      anon_unknown_20::ReadBinaryDataArray('i',count,&data,end,&buff,in_R9);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(out,(ulong)count);
      pcVar2 = buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (lVar6 = 0; count != (uint32_t)lVar6; lVar6 = lVar6 + 1) {
        if (*(int *)(pcVar2 + lVar6 * 4) < 0) {
          std::__cxx11::string::string
                    ((string *)&local_78,"encountered negative integer index (binary)",&local_79);
          anon_unknown.dwarf_bf1eac::ParseError(&local_78,(Element *)0x0);
        }
        local_78._M_dataplus._M_p._0_4_ = *(int *)(pcVar2 + lVar6 * 4);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (out,(uint *)&local_78);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&buff.super__Vector_base<char,_std::allocator<char>_>);
    }
  }
  else {
    __n = ParseTokenAsDim(t);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(out,__n);
    sc = GetRequiredScope(el);
    std::__cxx11::string::string((string *)&local_78,"a",(allocator *)&buff);
    pEVar4 = GetRequiredElement(sc,&local_78,el);
    std::__cxx11::string::~string((string *)&local_78);
    ppTVar1 = (pEVar4->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar5 = (pEVar4->tokens).
                   super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppTVar5 != ppTVar1;
        ppTVar5 = ppTVar5 + 1) {
      iVar3 = ParseTokenAsInt(*ppTVar5);
      if (iVar3 < 0) {
        std::__cxx11::string::string
                  ((string *)&local_78,"encountered negative integer index",(allocator *)&buff);
        anon_unknown.dwarf_bf1eac::ParseError(&local_78,(Element *)0x0);
      }
      local_78._M_dataplus._M_p._0_4_ = iVar3;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (out,(uint *)&local_78);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<unsigned int>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(!count) {
            return;
        }

        if (type != 'i') {
            ParseError("expected (u)int array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * 4);

        out.reserve(count);

        const int32_t* ip = reinterpret_cast<const int32_t*>(&buff[0]);
        for (unsigned int i = 0; i < count; ++i, ++ip) {
            BE_NCONST int32_t val = *ip;
            if(val < 0) {
                ParseError("encountered negative integer index (binary)");
            }

            AI_SWAP4(val);
            out.push_back(val);
        }

        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    // see notes in ParseVectorDataArray()
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        const int ival = ParseTokenAsInt(**it++);
        if(ival < 0) {
            ParseError("encountered negative integer index");
        }
        out.push_back(static_cast<unsigned int>(ival));
    }
}